

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(ImGuiContext *context)

{
  ImU32 IVar1;
  value_type local_40;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    local_40.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_40.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_40.TypeHash = 0;
    local_40._12_4_ = 0;
    local_40.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_40.UserData = (void *)0x0;
    local_40.TypeName = "Window";
    IVar1 = ImHash("Window",0,0);
    local_40.TypeHash = IVar1;
    local_40.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    local_40.ReadLineFn = SettingsHandlerWindow_ReadLine;
    local_40.WriteAllFn = SettingsHandlerWindow_WriteAll;
    ImVector<ImGuiSettingsHandler>::push_front(&context->SettingsHandlers,&local_40);
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0xe91,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Window";
    ini_handler.TypeHash = ImHash("Window", 0, 0);
    ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    ini_handler.ReadLineFn = SettingsHandlerWindow_ReadLine;
    ini_handler.WriteAllFn = SettingsHandlerWindow_WriteAll;
    g.SettingsHandlers.push_front(ini_handler);

    g.Initialized = true;
}